

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInExtensions(Generator *this)

{
  int iVar1;
  FieldDescriptor *extension_field;
  Descriptor *descriptor;
  int local_18;
  int local_14;
  int i_1;
  int i;
  Generator *this_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = FileDescriptor::extension_count(this->file_);
    if (iVar1 <= local_14) break;
    extension_field = FileDescriptor::extension(this->file_,local_14);
    FixForeignFieldsInExtension(this,extension_field);
    local_14 = local_14 + 1;
  }
  local_18 = 0;
  while( true ) {
    iVar1 = FileDescriptor::message_type_count(this->file_);
    if (iVar1 <= local_18) break;
    descriptor = FileDescriptor::message_type(this->file_,local_18);
    FixForeignFieldsInNestedExtensions(this,descriptor);
    local_18 = local_18 + 1;
  }
  io::Printer::Print(this->printer_,"\n");
  return;
}

Assistant:

void Generator::FixForeignFieldsInExtensions() const {
  // Top-level extensions.
  for (int i = 0; i < file_->extension_count(); ++i) {
    FixForeignFieldsInExtension(*file_->extension(i));
  }
  // Nested extensions.
  for (int i = 0; i < file_->message_type_count(); ++i) {
    FixForeignFieldsInNestedExtensions(*file_->message_type(i));
  }
  printer_->Print("\n");
}